

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::java::anon_unknown_0::GenerateGetBitInternal
                   (string *__return_storage_ptr__,string *prefix,int bitIndex)

{
  string mask;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string varName;
  
  GetBitFieldNameForBit_abi_cxx11_(&mask,(java *)(ulong)(uint)bitIndex,bitIndex);
  std::operator+(&varName,prefix,&mask);
  std::__cxx11::string::~string((string *)&mask);
  std::__cxx11::string::string
            ((string *)&mask,*(char **)(bit_masks + (long)(bitIndex % 0x20) * 8),
             (allocator *)&local_a0);
  std::operator+(&local_80,"((",&varName);
  std::operator+(&local_60,&local_80," & ");
  std::operator+(&local_a0,&local_60,&mask);
  std::operator+(__return_storage_ptr__,&local_a0,") != 0)");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&mask);
  std::__cxx11::string::~string((string *)&varName);
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateGetBitInternal(const std::string& prefix, int bitIndex) {
  std::string varName = prefix + GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = "((" + varName + " & " + mask + ") != 0)";
  return result;
}